

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolk.c
# Opt level: O3

int fffi8int(LONGLONG *input,long ntodo,double scale,double zero,int nullcheck,LONGLONG tnull,
            int nullval,char *nullarray,int *anynull,int *output,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  if (nullcheck == 0) {
    if (scale != 1.0 || zero != 9.223372036854776e+18) {
      if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
        if (0 < ntodo) {
          lVar3 = 0;
          do {
            dVar4 = (double)input[lVar3] * scale + zero;
            if (-2147483648.49 <= dVar4) {
              if (dVar4 <= 2147483647.49) {
                iVar1 = (int)dVar4;
              }
              else {
                *status = -0xb;
                iVar1 = 0x7fffffff;
              }
            }
            else {
              *status = -0xb;
              iVar1 = -0x80000000;
            }
            output[lVar3] = iVar1;
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
      }
      else if (0 < ntodo) {
        lVar3 = 0;
        do {
          lVar2 = input[lVar3];
          if (lVar2 < -0x80000000) {
            *status = -0xb;
            lVar2 = 0x80000000;
          }
          else if (0x7fffffff < lVar2) {
            *status = -0xb;
            lVar2 = 0x7fffffff;
          }
          output[lVar3] = (int)lVar2;
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
    }
    else if (0 < ntodo) {
      lVar3 = 0;
      do {
        lVar2 = input[lVar3];
        if (-0x7fffffff80000001 < lVar2) {
          *status = -0xb;
          lVar2 = 0x7fffffff;
        }
        output[lVar3] = (int)lVar2;
        lVar3 = lVar3 + 1;
      } while (ntodo != lVar3);
    }
  }
  else if (scale != 1.0 || zero != 9.223372036854776e+18) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      if (0 < ntodo) {
        lVar3 = 0;
        do {
          if (input[lVar3] == tnull) {
            *anynull = 1;
            if (nullcheck == 1) {
              output[lVar3] = nullval;
            }
            else {
              nullarray[lVar3] = '\x01';
            }
          }
          else {
            dVar4 = (double)input[lVar3] * scale + zero;
            if (-2147483648.49 <= dVar4) {
              if (dVar4 <= 2147483647.49) {
                output[lVar3] = (int)dVar4;
              }
              else {
                *status = -0xb;
                output[lVar3] = 0x7fffffff;
              }
            }
            else {
              *status = -0xb;
              output[lVar3] = -0x80000000;
            }
          }
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
    }
    else if (0 < ntodo) {
      lVar3 = 0;
      do {
        lVar2 = input[lVar3];
        if (lVar2 == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar3] = nullval;
          }
          else {
            nullarray[lVar3] = '\x01';
          }
        }
        else if (lVar2 < -0x80000000) {
          *status = -0xb;
          output[lVar3] = -0x80000000;
        }
        else if (lVar2 < 0x80000000) {
          output[lVar3] = (int)lVar2;
        }
        else {
          *status = -0xb;
          output[lVar3] = 0x7fffffff;
        }
        lVar3 = lVar3 + 1;
      } while (ntodo != lVar3);
    }
  }
  else if (0 < ntodo) {
    lVar3 = 0;
    do {
      lVar2 = input[lVar3];
      if (lVar2 == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar3] = nullval;
        }
        else {
          nullarray[lVar3] = '\x01';
        }
      }
      else if (lVar2 < -0x7fffffff80000000) {
        output[lVar3] = (int)lVar2;
      }
      else {
        *status = -0xb;
        output[lVar3] = 0x7fffffff;
      }
      lVar3 = lVar3 + 1;
    } while (ntodo != lVar3);
  }
  return *status;
}

Assistant:

int fffi8int(LONGLONG *input,     /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            LONGLONG tnull,       /* I - value of FITS TNULLn keyword if any */
            int  nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            int  *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    ULONGLONG ulltemp;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero ==  9223372036854775808.)
        {       
            /* The column we read contains unsigned long long values. */
            /* Instead of adding 9223372036854775808, it is more efficient */
            /* and more precise to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++) {
 
                ulltemp = (ULONGLONG) (((LONGLONG) input[ii]) ^ 0x8000000000000000);

                if (ulltemp > INT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = INT_MAX;
                }
                else
		{
                    output[ii] = (int) ulltemp;
		}
            }
        }
        else if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < INT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = INT_MIN;
                }
                else if (input[ii] > INT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = INT_MAX;
                }
                else
                    output[ii] = (int) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DINT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = INT_MIN;
                }
                else if (dvalue > DINT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = INT_MAX;
                }
                else
                    output[ii] = (int) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero ==  9223372036854775808.)
        {       
            /* The column we read contains unsigned long long values. */
            /* Instead of subtracting 9223372036854775808, it is more efficient */
            /* and more precise to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++) {
 
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
		{
                    ulltemp = (ULONGLONG) (((LONGLONG) input[ii]) ^ 0x8000000000000000);

                    if (ulltemp > INT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MAX;
                    }
                    else
		    {
                        output[ii] = (int) ulltemp;
		    }
                }
            }
        }
        else if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    if (input[ii] < INT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MIN;
                    }
                    else if (input[ii] > INT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MAX;
                    }
                    else
                        output[ii] = (int) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DINT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MIN;
                    }
                    else if (dvalue > DINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MAX;
                    }
                    else
                        output[ii] = (int) dvalue;
                }
            }
        }
    }
    return(*status);
}